

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::BasicWriter<char>::write_int<unsigned_long_long,fmt::FormatSpec>
          (BasicWriter<char> *this,unsigned_long_long value,FormatSpec spec)

{
  undefined4 uVar1;
  lconv *plVar2;
  size_t __n;
  CharPtr __dest;
  long lVar3;
  byte *pbVar4;
  CharPtr pcVar5;
  ulong uVar6;
  long lVar7;
  char *pcVar8;
  unsigned_long_long uVar9;
  byte bVar10;
  uint uVar11;
  ulong uVar12;
  bool bVar13;
  char in_stack_ffffffffffffffaf;
  undefined4 in_stack_ffffffffffffffb0;
  uint uVar14;
  
  uVar1 = spec._20_4_;
  uVar14 = 0;
  uVar11 = 0;
  if (((undefined1  [24])spec & (undefined1  [24])0x100000000) != (undefined1  [24])0x0) {
    bVar10 = 0x2b;
    if (((undefined1  [24])spec & (undefined1  [24])0x200000000) == (undefined1  [24])0x0) {
      bVar10 = 0x20;
    }
    uVar14 = (uint)bVar10;
    uVar11 = 1;
  }
  spec._20_4_ = uVar1;
  if ((byte)spec.type_ < 100) {
    if ((byte)spec.type_ < 0x58) {
      if (spec.type_ == '\0') goto LAB_001517ba;
      if (spec.type_ == 'B') {
LAB_001516cb:
        uVar14 = uVar11;
        if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
          (&stack0xffffffffffffffb4)[uVar11] = 0x30;
          uVar14 = uVar11 | 2;
          (&stack0xffffffffffffffb5)[uVar11] = spec.type_;
        }
        uVar11 = 0;
        uVar9 = value;
        do {
          uVar11 = uVar11 + 1;
          bVar13 = 1 < uVar9;
          uVar9 = uVar9 >> 1;
        } while (bVar13);
        pbVar4 = (byte *)prepare_int_buffer<fmt::FormatSpec>
                                   (this,uVar11,&spec,&stack0xffffffffffffffb4,uVar14);
        do {
          *pbVar4 = (byte)value & 1 | 0x30;
          pbVar4 = pbVar4 + -1;
          bVar13 = 1 < value;
          value = value >> 1;
        } while (bVar13);
        return;
      }
    }
    else {
      if (spec.type_ == 'X') goto LAB_0015173e;
      if (spec.type_ == 'b') goto LAB_001516cb;
    }
code_r0x0015193d:
    internal::report_unknown_type
              (in_stack_ffffffffffffffaf,(char *)CONCAT44(uVar14,in_stack_ffffffffffffffb0));
  }
  if (0x6e < (byte)spec.type_) {
    if (spec.type_ == 'o') {
      if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
        uVar6 = (ulong)uVar11;
        uVar11 = uVar11 + 1;
        (&stack0xffffffffffffffb4)[uVar6] = 0x30;
      }
      uVar14 = 0;
      uVar9 = value;
      do {
        uVar14 = uVar14 + 1;
        bVar13 = 7 < uVar9;
        uVar9 = uVar9 >> 3;
      } while (bVar13);
      pbVar4 = (byte *)prepare_int_buffer<fmt::FormatSpec>
                                 (this,uVar14,&spec,&stack0xffffffffffffffb4,uVar11);
      do {
        *pbVar4 = (byte)value & 7 | 0x30;
        pbVar4 = pbVar4 + -1;
        bVar13 = 7 < value;
        value = value >> 3;
      } while (bVar13);
      return;
    }
    if (spec.type_ == 'x') {
LAB_0015173e:
      uVar14 = uVar11;
      if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
        (&stack0xffffffffffffffb4)[uVar11] = 0x30;
        uVar14 = uVar11 | 2;
        (&stack0xffffffffffffffb5)[uVar11] = spec.type_;
      }
      uVar11 = 0;
      uVar9 = value;
      do {
        uVar11 = uVar11 + 1;
        bVar13 = 0xf < uVar9;
        uVar9 = uVar9 >> 4;
      } while (bVar13);
      pcVar5 = prepare_int_buffer<fmt::FormatSpec>
                         (this,uVar11,&spec,&stack0xffffffffffffffb4,uVar14);
      pcVar8 = "0123456789ABCDEF";
      if (spec.type_ == 'x') {
        pcVar8 = "0123456789abcdef";
      }
      do {
        *pcVar5 = pcVar8[(uint)value & 0xf];
        pcVar5 = pcVar5 + -1;
        bVar13 = 0xf < value;
        value = value >> 4;
      } while (bVar13);
      return;
    }
    goto code_r0x0015193d;
  }
  if (spec.type_ == 'd') {
LAB_001517ba:
    lVar7 = 0x3f;
    if ((value | 1) != 0) {
      for (; (value | 1) >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    uVar14 = ((uint)lVar7 ^ 0xffffffc0) * 0x4d1 + 0x13911 >> 0xc;
    pcVar5 = prepare_int_buffer<fmt::FormatSpec>
                       (this,(uVar14 - (value < *(ulong *)(internal::BasicData<void>::
                                                           POWERS_OF_10_64 + (ulong)uVar14 * 8))) +
                             1,&spec,&stack0xffffffffffffffb4,uVar11);
    pcVar5 = pcVar5 + 1;
    uVar6 = value;
    if (99 < value) {
      do {
        value = uVar6 / 100;
        *(undefined2 *)(pcVar5 + -2) =
             *(undefined2 *)
              (internal::BasicData<void>::DIGITS + (ulong)(uint)((int)uVar6 + (int)value * -100) * 2
              );
        pcVar5 = pcVar5 + -2;
        bVar13 = 9999 < uVar6;
        uVar6 = value;
      } while (bVar13);
    }
    if (value < 10) {
      bVar10 = (byte)value | 0x30;
      lVar7 = -1;
    }
    else {
      pcVar5[-1] = internal::BasicData<void>::DIGITS[(value * 2 & 0xffffffff) + 1];
      bVar10 = internal::BasicData<void>::DIGITS[value * 2 & 0x1fffffffe];
      lVar7 = -2;
    }
    pcVar5[lVar7] = bVar10;
    return;
  }
  if (spec.type_ != 'n') goto code_r0x0015193d;
  lVar7 = 0x3f;
  if ((value | 1) != 0) {
    for (; (value | 1) >> lVar7 == 0; lVar7 = lVar7 + -1) {
    }
  }
  uVar14 = ((uint)lVar7 ^ 0xffffffc0) * 0x4d1 + 0x13911 >> 0xc;
  plVar2 = localeconv();
  pcVar8 = plVar2->thousands_sep;
  __n = strlen(pcVar8);
  uVar14 = uVar14 - (value < *(ulong *)(internal::BasicData<void>::POWERS_OF_10_64 +
                                       (ulong)uVar14 * 8));
  __dest = prepare_int_buffer<fmt::FormatSpec>
                     (this,uVar14 + (int)__n * (uVar14 / 3) + 1,&spec,&stack0xffffffffffffffb4,
                      uVar11);
  pcVar5 = __dest + 1;
  if (value < 100) {
    if (9 < value) {
      uVar6 = (ulong)(uint)((int)value * 2);
      *__dest = internal::BasicData<void>::DIGITS[uVar6 + 1];
      goto LAB_00151909;
    }
  }
  else {
    lVar7 = -__n;
    uVar11 = 0;
    do {
      uVar14 = uVar11;
      uVar6 = value;
      value = uVar6 / 100;
      uVar12 = (ulong)(uint)(((int)uVar6 + (int)value * -100) * 2);
      pcVar5[-1] = internal::BasicData<void>::DIGITS[uVar12 + 1];
      if ((uVar14 | 1) * -0x55555555 < 0x55555556) {
        pcVar5 = pcVar5 + lVar7 + -1;
        if (__n == 0) {
          pcVar5[-1] = internal::BasicData<void>::DIGITS[uVar12];
          lVar3 = 0;
          if ((uVar14 + 2) * -0x55555555 < 0x55555556) {
            lVar3 = lVar7;
          }
          pcVar5 = pcVar5 + lVar3 + -1;
        }
        else {
          memmove(pcVar5,pcVar8,__n);
          pcVar5[-1] = internal::BasicData<void>::DIGITS[uVar12];
          pcVar5 = pcVar5 + -1;
          if ((uVar14 + 2) * -0x55555555 < 0x55555556) {
            pcVar5 = pcVar5 + lVar7;
            goto LAB_0015163c;
          }
        }
      }
      else {
        pcVar5[-2] = internal::BasicData<void>::DIGITS[uVar12];
        pcVar5 = pcVar5 + -2;
        if (((uVar14 + 2) * -0x55555555 < 0x55555556) && (pcVar5 = pcVar5 + lVar7, __n != 0)) {
LAB_0015163c:
          memmove(pcVar5,pcVar8,__n);
        }
      }
      uVar11 = uVar14 + 2;
    } while (9999 < uVar6);
    if (999 < uVar6) {
      uVar6 = (ulong)(uint)((int)value * 2);
      __dest = pcVar5 + -1;
      pcVar5[-1] = internal::BasicData<void>::DIGITS[uVar6 + 1];
      if ((uVar14 * -0x55555555 + 1 < 0x55555556) && (__dest = __dest + -__n, __n != 0)) {
        memmove(__dest,pcVar8,__n);
      }
LAB_00151909:
      bVar10 = internal::BasicData<void>::DIGITS[uVar6];
      pcVar5 = __dest;
      goto LAB_00151915;
    }
  }
  bVar10 = (byte)value | 0x30;
LAB_00151915:
  pcVar5[-1] = bVar10;
  return;
}

Assistant:

void BasicWriter<Char>::write_int(T value, Spec spec)
{
    unsigned prefix_size = 0;
    typedef typename internal::IntTraits<T>::MainType UnsignedType;
    UnsignedType abs_value = static_cast<UnsignedType>(value);
    char prefix[4] = "";
    if (internal::is_negative(value))
    {
        prefix[0] = '-';
        ++prefix_size;
        abs_value = 0 - abs_value;
    }
    else if (spec.flag(SIGN_FLAG))
    {
        prefix[0] = spec.flag(PLUS_FLAG) ? '+' : ' ';
        ++prefix_size;
    }
    switch (spec.type())
    {
    case 0:
    case 'd':
    {
        unsigned num_digits = internal::count_digits(abs_value);
        CharPtr p = prepare_int_buffer(num_digits, spec, prefix, prefix_size) + 1;
        internal::format_decimal(get(p), abs_value, 0);
        break;
    }
    case 'x':
    case 'X':
    {
        UnsignedType n = abs_value;
        if (spec.flag(HASH_FLAG))
        {
            prefix[prefix_size++] = '0';
            prefix[prefix_size++] = spec.type_prefix();
        }
        unsigned num_digits = 0;
        do
        {
            ++num_digits;
        } while ((n >>= 4) != 0);
        Char *p = get(prepare_int_buffer(num_digits, spec, prefix, prefix_size));
        n = abs_value;
        const char *digits = spec.type() == 'x' ? "0123456789abcdef" : "0123456789ABCDEF";
        do
        {
            *p-- = digits[n & 0xf];
        } while ((n >>= 4) != 0);
        break;
    }
    case 'b':
    case 'B':
    {
        UnsignedType n = abs_value;
        if (spec.flag(HASH_FLAG))
        {
            prefix[prefix_size++] = '0';
            prefix[prefix_size++] = spec.type_prefix();
        }
        unsigned num_digits = 0;
        do
        {
            ++num_digits;
        } while ((n >>= 1) != 0);
        Char *p = get(prepare_int_buffer(num_digits, spec, prefix, prefix_size));
        n = abs_value;
        do
        {
            *p-- = static_cast<Char>('0' + (n & 1));
        } while ((n >>= 1) != 0);
        break;
    }
    case 'o':
    {
        UnsignedType n = abs_value;
        if (spec.flag(HASH_FLAG))
            prefix[prefix_size++] = '0';
        unsigned num_digits = 0;
        do
        {
            ++num_digits;
        } while ((n >>= 3) != 0);
        Char *p = get(prepare_int_buffer(num_digits, spec, prefix, prefix_size));
        n = abs_value;
        do
        {
            *p-- = static_cast<Char>('0' + (n & 7));
        } while ((n >>= 3) != 0);
        break;
    }
    case 'n':
    {
        unsigned num_digits = internal::count_digits(abs_value);
        fmt::StringRef sep = "";
#if !(defined(ANDROID) || defined(__ANDROID__))
        sep = internal::thousands_sep(std::localeconv());
#endif
        unsigned size = static_cast<unsigned>(num_digits + sep.size() * ((num_digits - 1) / 3));
        CharPtr p = prepare_int_buffer(size, spec, prefix, prefix_size) + 1;
        internal::format_decimal(get(p), abs_value, 0, internal::ThousandsSep(sep));
        break;
    }
    default:
        internal::report_unknown_type(spec.type(), spec.flag(CHAR_FLAG) ? "char" : "integer");
        break;
    }
}